

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O0

void parse_tok(char **p,char **tok,size_t *tok_len)

{
  int iVar1;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  bool bVar2;
  
  while( true ) {
    iVar1 = isspace((int)*(char *)*in_RDI);
    if (iVar1 == 0) break;
    *in_RDI = *in_RDI + 1;
  }
  *in_RSI = *in_RDI;
  while( true ) {
    bVar2 = false;
    if (*(char *)*in_RDI != '\0') {
      iVar1 = isspace((int)*(char *)*in_RDI);
      bVar2 = false;
      if ((iVar1 == 0) && (bVar2 = false, *(char *)*in_RDI != '\n')) {
        bVar2 = *(char *)*in_RDI != '\r';
      }
    }
    if (!bVar2) break;
    *in_RDI = *in_RDI + 1;
  }
  *in_RDX = *in_RDI - *in_RSI;
  return;
}

Assistant:

static void parse_tok(char *&p, char *&tok, size_t &tok_len)
{
    /* skip leading spaces */
    for ( ; isspace(*p) ; ++p) ;

    /* the token starts here */
    tok = p;

    /* 
     *   find the end of the token - it's the end of the string, or the next
     *   whitespace or newline (CR or LF) character 
     */
    for ( ; *p != '\0' && !isspace(*p) && *p != '\n' && *p != '\r' ; ++p) ;

    /* note the length of the token */
    tok_len = p - tok;
}